

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

Position aiBegin(char (*board) [15],int me)

{
  char *pcVar1;
  Position PVar2;
  Position PVar3;
  long lVar4;
  long lVar5;
  
  PVar3.x = 0;
  PVar3.y = -1;
  lVar4 = 0;
  do {
    if (lVar4 == 0xf) {
      PVar2.x = 0;
      PVar2.y = 0;
      return PVar2;
    }
    lVar5 = 0;
    PVar2 = PVar3;
    while (lVar5 != 0xf) {
      PVar2 = (Position)((long)PVar2 + 0x100000000);
      pcVar1 = *board + lVar5;
      lVar5 = lVar5 + 1;
      if (*pcVar1 == '\0') {
        return PVar2;
      }
    }
    lVar4 = lVar4 + 1;
    PVar3 = (Position)((long)PVar3 + 1);
    board = board + 1;
  } while( true );
}

Assistant:

struct Position aiBegin(const char board[BOARD_SIZE][BOARD_SIZE], int me) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。 
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。 
     */
    int i, j;
    struct Position preferedPos = {0, 0};

    for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
            if (EMPTY == board[i][j]) {
                preferedPos.x = i;
                preferedPos.y = j;
                return preferedPos;
            }
        }
    }

    return preferedPos;
}